

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O1

bool __thiscall FTraceInfo::ThingCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  AActor *pAVar1;
  sector_t *psVar2;
  FTraceResults *pFVar3;
  byte bVar4;
  bool bVar5;
  ETraceStatus EVar6;
  extsector_t *peVar7;
  long lVar8;
  ETraceResult EVar9;
  secplane_t *plane;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar12 = (((in->d).thing)->__Pos).Z;
  dVar11 = ((in->d).thing)->Height + dVar12;
  if (hit->Z <= dVar11) {
    if (hit->Z < dVar12) {
      dVar11 = (this->Vec).Z;
      bVar4 = 1;
      if (dVar11 <= 0.0) goto LAB_0054fbb5;
      dVar10 = (this->Start).Z;
      dVar13 = this->MaxDist;
      dist = (dVar12 - dVar10) / dVar11;
      goto LAB_0054f90e;
    }
  }
  else {
    dVar12 = (this->Vec).Z;
    bVar4 = 1;
    if (0.0 <= dVar12) goto LAB_0054fbb5;
    dVar10 = (this->Start).Z;
    dVar13 = this->MaxDist;
    dist = (dVar11 - dVar10) / dVar12;
LAB_0054f90e:
    bVar4 = 1;
    if (dVar13 < dist) goto LAB_0054fbb5;
    in->frac = dist / dVar13;
    dVar12 = (this->Vec).X * dist + (this->Start).X;
    dVar11 = (this->Vec).Y * dist + (this->Start).Y;
    hit->Z = dVar10 + (this->Vec).Z * dist;
    hit->Y = dVar11;
    hit->X = dVar12;
    pAVar1 = (in->d).thing;
    if ((pAVar1->radius < ABS(dVar12 - (pAVar1->__Pos).X)) ||
       (pAVar1->radius < ABS(dVar11 - (pAVar1->__Pos).Y))) goto LAB_0054fbb5;
  }
  psVar2 = this->CurSector;
  peVar7 = psVar2->e;
  if ((peVar7->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    if ((hit->Z <= (hit->Y * (psVar2->ceilingplane).normal.Y +
                   hit->X * (psVar2->ceilingplane).normal.X + (psVar2->ceilingplane).D) *
                   (psVar2->ceilingplane).negiC) ||
       (peVar7 = (extsector_t *)0x0, (psVar2->planes[1].Flags & 0x1d0U) == 0x100)) {
      bVar4 = (byte)peVar7;
      if ((hit->Z < ((psVar2->floorplane).normal.Y * hit->Y +
                    (psVar2->floorplane).normal.X * hit->X + (psVar2->floorplane).D) *
                    (psVar2->floorplane).negiC) &&
         (bVar4 = 0, (psVar2->planes[0].Flags & 0x1d0U) != 0x100)) {
        lVar8 = 0x48;
        EVar9 = TRACE_HitFloor;
        goto LAB_0054fa5f;
      }
switchD_0054faeb_default:
      bVar5 = false;
    }
    else {
      lVar8 = 0xa0;
      EVar9 = TRACE_HitCeiling;
LAB_0054fa5f:
      pFVar3 = this->Results;
      pFVar3->HitType = EVar9;
      (pFVar3->HitTexture).texnum = *(int *)((long)&psVar2->planes[0].xform.xOffs + lVar8);
      pFVar3 = this->Results;
      pFVar3->Sector = sectors + psVar2->sectornum;
      plane = &psVar2->floorplane;
      if (pFVar3->HitType != TRACE_HitFloor) {
        plane = &psVar2->ceilingplane;
      }
      bVar5 = CheckPlane(this,plane);
      if (!bVar5) {
        this->Results->HitType = TRACE_HitNone;
      }
      if (this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) {
        EVar6 = (*this->TraceCallback)(this->Results,this->TraceCallbackData);
        bVar4 = (byte)EVar6;
        bVar5 = true;
        switch(EVar6) {
        case TRACE_Stop:
          break;
        case TRACE_Skip:
          this->Results->HitType = TRACE_HitNone;
        case TRACE_Continue:
          bVar4 = 1;
          goto LAB_0054fb17;
        case TRACE_Abort:
          this->Results->HitType = TRACE_HitNone;
          break;
        default:
          goto switchD_0054faeb_default;
        }
      }
      bVar5 = true;
      bVar4 = 0;
    }
LAB_0054fb17:
    if (bVar5) goto LAB_0054fbb5;
  }
  pFVar3 = this->Results;
  pFVar3->HitType = TRACE_HitActor;
  (pFVar3->HitPos).Z = hit->Z;
  (pFVar3->HitPos).Y = hit->Y;
  (pFVar3->HitPos).X = hit->X;
  SetSourcePosition(this);
  pFVar3 = this->Results;
  pFVar3->Distance = dist;
  pFVar3->Fraction = in->frac;
  pFVar3->Actor = (AActor *)in->d;
  if ((this->TraceCallback == (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) ||
     (EVar6 = (*this->TraceCallback)(pFVar3,this->TraceCallbackData), EVar6 == TRACE_Stop)) {
LAB_0054fba1:
    bVar4 = 0;
  }
  else {
    if (EVar6 == TRACE_Skip) {
      this->Results->HitType = TRACE_HitNone;
    }
    else if (EVar6 == TRACE_Abort) {
      this->Results->HitType = TRACE_HitNone;
      goto LAB_0054fba1;
    }
    bVar4 = 1;
  }
LAB_0054fbb5:
  return (bool)(bVar4 & 1);
}

Assistant:

bool FTraceInfo::ThingCheck(intercept_t *in, double dist, DVector3 hit)
{
	if (hit.Z > in->d.thing->Top())
	{
		// trace enters above actor
		if (Vec.Z >= 0) return true;      // Going up: can't hit

		// Does it hit the top of the actor?
		dist = (in->d.thing->Top() - Start.Z) / Vec.Z;

		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}
	else if (hit.Z < in->d.thing->Z())
	{ // trace enters below actor
		if (Vec.Z <= 0) return true;      // Going down: can't hit

		// Does it hit the bottom of the actor?
		dist = (in->d.thing->Z() - Start.Z) / Vec.Z;
		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}

	if (CurSector->e->XFloor.ffloors.Size())
	{
		// check for 3D floor hits first.
		double ff_floor = CurSector->floorplane.ZatPoint(hit);
		double ff_ceiling = CurSector->ceilingplane.ZatPoint(hit);

		if (hit.Z > ff_ceiling && CurSector->PortalBlocksMovement(sector_t::ceiling))	// actor is hit above the current ceiling
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
		else if (hit.Z < ff_floor && CurSector->PortalBlocksMovement(sector_t::floor))	// actor is hit below the current floor
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else goto cont1;

		// the trace hit a 3D floor before the thing.
		// Calculate an intersection and abort.
		Results->Sector = &sectors[CurSector->sectornum];
		if (!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{
			Results->HitType = TRACE_HitNone;
		}
		if (TraceCallback != NULL)
		{
			switch (TraceCallback(*Results, TraceCallbackData))
			{
			case TRACE_Continue: return true;
			case TRACE_Stop:	 return false;
			case TRACE_Abort:	 Results->HitType = TRACE_HitNone; return false;
			case TRACE_Skip:	 Results->HitType = TRACE_HitNone; return true;
			}
		}
		else
		{
			return false;
		}
	}
cont1:


	Results->HitType = TRACE_HitActor;
	Results->HitPos = hit;
	SetSourcePosition();
	Results->Distance = dist;
	Results->Fraction = in->frac;
	Results->Actor = in->d.thing;

	if (TraceCallback != NULL)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; return true;
		default:			return true;
		}
	}
	else
	{
		return false;
	}
}